

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# masterserver.cpp
# Opt level: O0

int __thiscall CMasterServer::Load(CMasterServer *this)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  char *pcVar4;
  long in_FS_OFFSET;
  char *b;
  char *string;
  undefined4 in_stack_ffffffffffffee08;
  undefined4 in_stack_ffffffffffffee0c;
  int i_1;
  int i;
  bool Added;
  char *pLine;
  IOHANDLE File;
  CMasterServer *this_local;
  int local_11bc;
  char aAddrStr [48];
  CMasterInfo Info;
  CLineReader LineReader;
  
  LineReader.m_aBuffer[0x20] = '\0';
  LineReader.m_aBuffer[0x21] = '\0';
  LineReader.m_aBuffer[0x22] = '\0';
  LineReader.m_aBuffer[0x23] = '\0';
  LineReader.m_aBuffer[0x24] = '\0';
  LineReader.m_aBuffer[0x25] = '\0';
  LineReader.m_aBuffer[0x26] = '\0';
  LineReader.m_aBuffer[0x27] = '\0';
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->m_pStorage == (IStorage *)0x0) {
    local_11bc = -1;
  }
  else {
    b = (char *)0x0;
    string = (char *)0x0;
    iVar3 = (*(this->m_pStorage->super_IInterface)._vptr_IInterface[4])
                      (this->m_pStorage,"masters.cfg",9,0,0);
    if ((IOHANDLE)CONCAT44(extraout_var,iVar3) == (IOHANDLE)0x0) {
      local_11bc = -1;
    }
    else {
      CLineReader::Init(&LineReader,(IOHANDLE)CONCAT44(extraout_var,iVar3));
      do {
        do {
          memset(&Info,0,0x168);
          CJob::CJob(&Info.m_Lookup.m_Job);
          pcVar4 = CLineReader::Get((CLineReader *)
                                    CONCAT44(in_stack_ffffffffffffee0c,in_stack_ffffffffffffee08));
          if (pcVar4 == (char *)0x0) goto LAB_0023fc0a;
          iVar3 = __isoc99_sscanf(pcVar4,"%127s %47s",&Info,aAddrStr);
        } while ((iVar3 != 2) ||
                (iVar3 = net_addr_from_str((NETADDR *)
                                           CONCAT44(in_stack_ffffffffffffee0c,
                                                    in_stack_ffffffffffffee08),string), iVar3 != 0))
        ;
        Info.m_Addr.port = 0x205b;
        bVar2 = false;
        for (i = 0; i < 4; i = i + 1) {
          iVar3 = str_comp(string,b);
          if (iVar3 == 0) {
            memcpy(this->m_aMasterServers + i,&Info,0x168);
            bVar2 = true;
            break;
          }
        }
        if (!bVar2) {
          for (i_1 = 0; i_1 < 4; i_1 = i_1 + 1) {
            if (this->m_aMasterServers[i_1].m_Addr.type == 0) {
              memcpy(this->m_aMasterServers + i_1,&Info,0x168);
              bVar2 = true;
              break;
            }
          }
        }
      } while (bVar2);
LAB_0023fc0a:
      io_close((IOHANDLE)0x23fc14);
      local_11bc = 0;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_11bc;
}

Assistant:

virtual int Load()
	{
		if(!m_pStorage)
			return -1;

		// try to open file
		IOHANDLE File = m_pStorage->OpenFile("masters.cfg", IOFLAG_READ | IOFLAG_SKIP_BOM, IStorage::TYPE_SAVE);
		if(!File)
			return -1;

		CLineReader LineReader;
		LineReader.Init(File);
		while(1)
		{
			CMasterInfo Info = {{0}};
			const char *pLine = LineReader.Get();
			if(!pLine)
				break;

			// parse line
			char aAddrStr[NETADDR_MAXSTRSIZE];
			if(sscanf(pLine, "%127s %47s", Info.m_aHostname, aAddrStr) == 2 && net_addr_from_str(&Info.m_Addr, aAddrStr) == 0)
			{
				Info.m_Addr.port = MASTERSERVER_PORT;
				bool Added = false;
				for(int i = 0; i < MAX_MASTERSERVERS; ++i)
					if(str_comp(m_aMasterServers[i].m_aHostname, Info.m_aHostname) == 0)
					{
						m_aMasterServers[i] = Info;
						Added = true;
						break;
					}

				if(!Added)
				{
					for(int i = 0; i < MAX_MASTERSERVERS; ++i)
						if(m_aMasterServers[i].m_Addr.type == NETTYPE_INVALID)
						{
							m_aMasterServers[i] = Info;
							Added = true;
							break;
						}
				}

				if(!Added)
					break;
			}
		}

		io_close(File);
		return 0;
	}